

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O0

void __thiscall
VBitmap::Impl::reset
          (Impl *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,Format format)

{
  uint8_t uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  nullptr_t in_RDI;
  undefined4 in_R8D;
  Format in_R9B;
  undefined7 in_stack_ffffffffffffffd0;
  
  *(undefined8 *)((long)in_RDI + 8) = in_RSI;
  *(undefined4 *)((long)in_RDI + 0x10) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x14) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x18) = in_R8D;
  *(Format *)((long)in_RDI + 0x1d) = in_R9B;
  uVar1 = depth(in_R9B);
  *(uint8_t *)((long)in_RDI + 0x1c) = uVar1;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_RDI);
  return;
}

Assistant:

void VBitmap::Impl::reset(uint8_t *data, size_t width, size_t height,
                          size_t bytesPerLine, VBitmap::Format format)
{
    mRoData = data;
    mWidth = uint32_t(width);
    mHeight = uint32_t(height);
    mStride = uint32_t(bytesPerLine);
    mFormat = format;
    mDepth = depth(format);
    mOwnData = nullptr;
}